

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

aiAnimation * MakeDummyAnimation(void)

{
  aiAnimation *this;
  aiNodeAnim **ppaVar1;
  aiNodeAnim *this_00;
  aiNodeAnim *anim;
  aiAnimation *p;
  
  this = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this);
  this->mNumChannels = 1;
  ppaVar1 = (aiNodeAnim **)operator_new__(8);
  this->mChannels = ppaVar1;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this_00);
  *this->mChannels = this_00;
  aiString::Set((aiString *)this_00,"<test>");
  return this;
}

Assistant:

aiAnimation* MakeDummyAnimation() {
    aiAnimation* p = new aiAnimation();
    p->mNumChannels = 1;
    p->mChannels = new aiNodeAnim*[1];
    aiNodeAnim* anim = p->mChannels[0] = new aiNodeAnim();
    anim->mNodeName.Set("<test>");
    return p;
}